

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O0

double Timer::now(bool measureWallclockTime)

{
  int iVar1;
  byte in_DIL;
  rusage res;
  timeval time;
  rusage local_b0;
  timeval local_20;
  byte local_9;
  double local_8;
  
  local_9 = in_DIL & 1;
  if (local_9 == 0) {
    getrusage(RUSAGE_SELF,&local_b0);
    local_8 = (double)(local_b0.ru_utime.tv_usec + local_b0.ru_stime.tv_usec) * 1e-06 +
              (double)(local_b0.ru_utime.tv_sec + local_b0.ru_stime.tv_sec);
  }
  else {
    iVar1 = gettimeofday(&local_20,(__timezone_ptr_t)0x0);
    if (iVar1 == 0) {
      local_8 = (double)local_20.tv_usec * 1e-06 + (double)local_20.tv_sec;
    }
    else {
      local_8 = 0.0;
    }
  }
  return local_8;
}

Assistant:

static double now(bool measureWallclockTime = true) {
#ifdef _WIN32
		if(measureWallclockTime){
			return static_cast<double>(std::clock()) / CLOCKS_PER_SEC;
		}
		else{
			LARGE_INTEGER tick, tps;
			QueryPerformanceFrequency(&tps);
			QueryPerformanceCounter(&tick);
			return( static_cast<double>( tick.QuadPart ) / static_cast<double>( tps.QuadPart ) );
		}
#else
		if(measureWallclockTime){
			timeval time;
			if (gettimeofday(&time,0)){
				//  Handle error
				return 0;
			}
			return time.tv_sec +1e-6 *time.tv_usec;
		}
		else
		{
			rusage res;
			getrusage(RUSAGE_SELF, &res);
			return(res.ru_utime.tv_sec + res.ru_stime.tv_sec)
				+ 1e-6 * (res.ru_utime.tv_usec + res.ru_stime.tv_usec);
		}
#endif
	}